

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O2

void __thiscall Search::Search(Search *this,ifstream *ifs,Point *maze_entry,Point *maze_target)

{
  this->_vptr_Search = (_func_int **)&PTR___cxa_pure_virtual_00107cb0;
  this->num_nodes = 0;
  (this->final).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->final).super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Maze::Maze(&this->maze,ifs);
  this->entry = *maze_entry;
  this->target = *maze_target;
  (this->visited).super__Vector_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->visited).super__Vector_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->visited).super__Vector_base<std::shared_ptr<Node>,_std::allocator<std::shared_ptr<Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->visited_points)._M_h._M_buckets = &(this->visited_points)._M_h._M_single_bucket;
  (this->visited_points)._M_h._M_bucket_count = 1;
  (this->visited_points)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->visited_points)._M_h._M_element_count = 0;
  (this->visited_points)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->visited_points)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->visited_points)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Search::Search(ifstream &ifs, const Point &maze_entry, const Point &maze_target) : maze(ifs), entry(maze_entry),
                                                                                   target(maze_target), num_nodes(0) {}